

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

uint av1_get_perpixel_variance_facade
               (AV1_COMP *cpi,MACROBLOCKD *xd,buf_2d *ref,BLOCK_SIZE bsize,int plane)

{
  uint uVar1;
  
  uVar1 = av1_get_perpixel_variance(cpi,xd,ref,bsize,plane,(uint)xd->cur_buf->flags >> 3 & 1);
  return uVar1;
}

Assistant:

static inline int is_cur_buf_hbd(const MACROBLOCKD *xd) {
#if CONFIG_AV1_HIGHBITDEPTH
  return xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH ? 1 : 0;
#else
  (void)xd;
  return 0;
#endif
}